

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O3

void __thiscall
MipTimer::reportMipEvaluateRootNodeClock(MipTimer *this,HighsTimerClock *mip_timer_clock)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> mip_clock_list;
  allocator_type local_89;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  int local_58 [16];
  
  local_58[0xc] = 0x1f;
  local_58[0xd] = 0x20;
  local_58[0xe] = 0x21;
  local_58[0xf] = 0x22;
  local_58[8] = 0x1b;
  local_58[9] = 0x1c;
  local_58[10] = 0x1d;
  local_58[0xb] = 0x1e;
  local_58[4] = 0x17;
  local_58[5] = 0x18;
  local_58[6] = 0x19;
  local_58[7] = 0x1a;
  local_58[0] = 0x13;
  local_58[1] = 0x14;
  local_58[2] = 0x15;
  local_58[3] = 0x16;
  __l._M_len = 0x10;
  __l._M_array = local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,&local_89);
  std::vector<int,_std::allocator<int>_>::vector(&local_88,&local_70);
  reportMipClockList(this,"MipEvaluateRootNode",&local_88,mip_timer_clock,8,-1.0);
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void reportMipEvaluateRootNodeClock(const HighsTimerClock& mip_timer_clock) {
    const std::vector<HighsInt> mip_clock_list{
        kMipClockStartSymmetryDetection,
        kMipClockStartAnalyticCentreComputation,
        kMipClockEvaluateRootLp,
        kMipClockSeparateLpCuts,
        kMipClockRandomizedRounding,
        kMipClockPerformRestart,
        kMipClockRootSeparation,
        kMipClockFinishAnalyticCentreComputation,
        kMipClockRootCentralRounding,
        kMipClockRootSeparationRound0,
        kMipClockRootHeuristicsReducedCost,
        kMipClockRootSeparationRound1,
        kMipClockRootHeuristicsRens,
        kMipClockRootSeparationRound2,
        kMipClockRootFeasibilityPump,
        kMipClockRootSeparationRound3
        //	kMipClock@,
        //	kMipClock@
    };
    reportMipClockList(
        "MipEvaluateRootNode", mip_clock_list, mip_timer_clock,
        kMipClockEvaluateRootNode);  //, tolerance_percent_report);
  }